

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O3

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::toCCDF(Distributions *this,vector<double,_std::allocator<double>_> *distribution)

{
  pointer pdVar1;
  pointer pdVar2;
  bool bVar3;
  vector<double,_std::allocator<double>_> *this_00;
  ulong uVar4;
  pointer *__ptr;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  allocator_type local_21;
  value_type_conflict4 local_20;
  
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3,&local_20,&local_21);
  *(vector<double,_std::allocator<double>_> **)this = this_00;
  pdVar1 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
    if (uVar4 <= lVar8 - 1U) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    pdVar2[lVar8 + -1] = pdVar1[lVar8 + -1];
    uVar7 = (int)lVar8 - 2;
    if (-1 < (int)uVar7) {
      uVar5 = (ulong)uVar7 + 1;
      do {
        if (uVar4 <= uVar5) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        pdVar2[uVar5 - 1] = pdVar1[uVar5 - 1] + pdVar2[uVar5];
        uVar6 = uVar5 - 1;
        bVar3 = 0 < (long)uVar5;
        uVar5 = uVar6;
      } while (uVar6 != 0 && bVar3);
    }
  }
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::toCCDF(const vector<double>& distribution) {
	unique_ptr<vector<double> > result(new vector<double>(distribution.size(), 0.0));
	if (distribution.size() == 0) return result;
	result->at(distribution.size()-1) = distribution[distribution.size()-1];
	for (int i=distribution.size()-2; i>=0; --i) {
		result->at(i) = distribution[i] + result->at(i+1);
	}
	return result;
}